

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O3

void telnet_send_vzmpv(telnet_t *telnet,__va_list_tag *va)

{
  uint uVar1;
  char *__s;
  undefined8 *puVar2;
  size_t sVar3;
  uchar sb [5];
  char local_1f [7];
  
  local_1f[2] = -1;
  local_1f[3] = -6;
  local_1f[4] = 0x5d;
  _send(telnet,local_1f + 2,3);
  while( true ) {
    uVar1 = va->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar2 = (undefined8 *)((ulong)uVar1 + (long)va->reg_save_area);
      va->gp_offset = uVar1 + 8;
    }
    else {
      puVar2 = (undefined8 *)va->overflow_arg_area;
      va->overflow_arg_area = puVar2 + 1;
    }
    __s = (char *)*puVar2;
    if (__s == (char *)0x0) break;
    sVar3 = strlen(__s);
    telnet_send(telnet,__s,sVar3 + 1);
  }
  local_1f[0] = -1;
  local_1f[1] = -0x10;
  _send(telnet,local_1f,2);
  return;
}

Assistant:

void telnet_send_vzmpv(telnet_t *telnet, va_list va) {
	const char* arg;

	/* ZMP header */
	telnet_begin_sb(telnet, TELNET_TELOPT_ZMP);

	/* send out each argument, including trailing NUL byte */
	while ((arg = va_arg(va, const char *)) != 0)
		telnet_zmp_arg(telnet, arg);

	/* ZMP footer */
	telnet_finish_zmp(telnet);
}